

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsPostsolveStack.h
# Opt level: O3

void __thiscall
presolve::HighsPostsolveStack::freeColSubstitution<HighsTripletPositionSlice,HighsTripletListSlice>
          (HighsPostsolveStack *this,HighsInt row,HighsInt col,double rhs,double colCost,
          RowType rowType,HighsMatrixSlice<HighsTripletPositionSlice> *rowVec,
          HighsMatrixSlice<HighsTripletListSlice> *colVec)

{
  HighsDataStack *this_00;
  int iVar1;
  int iVar2;
  pointer pNVar3;
  HighsInt *pHVar4;
  pointer pcVar5;
  pointer pcVar6;
  pointer pcVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  int *piVar11;
  double *pdVar12;
  size_t position;
  ReductionType local_71;
  double local_70;
  HighsInt local_64;
  HighsInt local_60;
  RowType local_5c;
  vector<presolve::HighsPostsolveStack::Nonzero,std::allocator<presolve::HighsPostsolveStack::Nonzero>>
  *local_58;
  HighsMatrixSlice<HighsTripletListSlice> *local_50;
  double local_48;
  double local_40;
  HighsInt *local_38;
  
  pNVar3 = (this->rowValues).
           super__Vector_base<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->rowValues).
      super__Vector_base<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
      ._M_impl.super__Vector_impl_data._M_finish != pNVar3) {
    (this->rowValues).
    super__Vector_base<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
    ._M_impl.super__Vector_impl_data._M_finish = pNVar3;
  }
  local_58 = (vector<presolve::HighsPostsolveStack::Nonzero,std::allocator<presolve::HighsPostsolveStack::Nonzero>>
              *)&this->rowValues;
  iVar1 = rowVec->len;
  local_64 = row;
  local_60 = col;
  local_5c = rowType;
  local_50 = colVec;
  local_48 = rhs;
  local_40 = colCost;
  if ((long)iVar1 != 0) {
    local_38 = rowVec->nodePositions;
    piVar11 = rowVec->nodeIndex;
    pdVar12 = rowVec->nodeValue;
    lVar10 = 0;
    iVar9 = 0;
    do {
      iVar2 = *(int *)((long)local_38 + lVar10);
      iVar9 = iVar2 - iVar9;
      piVar11 = piVar11 + iVar9;
      pdVar12 = pdVar12 + iVar9;
      local_70 = *pdVar12;
      std::
      vector<presolve::HighsPostsolveStack::Nonzero,std::allocator<presolve::HighsPostsolveStack::Nonzero>>
      ::emplace_back<int&,double>
                (local_58,(this->origColIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl
                          .super__Vector_impl_data._M_start + *piVar11,&local_70);
      lVar10 = lVar10 + 4;
      iVar9 = iVar2;
    } while ((long)iVar1 * 4 != lVar10);
  }
  pNVar3 = (this->colValues).
           super__Vector_base<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->colValues).
      super__Vector_base<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
      ._M_impl.super__Vector_impl_data._M_finish != pNVar3) {
    (this->colValues).
    super__Vector_base<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
    ._M_impl.super__Vector_impl_data._M_finish = pNVar3;
  }
  lVar10 = (long)local_50->head;
  if (lVar10 != -1) {
    pHVar4 = local_50->nodeNext;
    pdVar12 = local_50->nodeValue + lVar10;
    piVar11 = local_50->nodeIndex + lVar10;
    do {
      local_70 = *pdVar12;
      std::
      vector<presolve::HighsPostsolveStack::Nonzero,std::allocator<presolve::HighsPostsolveStack::Nonzero>>
      ::emplace_back<int&,double>
                ((vector<presolve::HighsPostsolveStack::Nonzero,std::allocator<presolve::HighsPostsolveStack::Nonzero>>
                  *)&this->colValues,
                 (this->origRowIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start + *piVar11,&local_70);
      lVar8 = (long)(int)lVar10;
      lVar10 = (long)pHVar4[lVar8];
      piVar11 = piVar11 + (lVar10 - lVar8);
      pdVar12 = pdVar12 + (lVar10 - lVar8);
    } while (lVar10 != -1);
  }
  this_00 = &this->reductionValues;
  iVar1 = (this->origRowIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[local_64];
  pcVar5 = (this->reductionValues).data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  iVar9 = (this->origColIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[local_60];
  pcVar6 = (this->reductionValues).data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  std::vector<char,_std::allocator<char>_>::resize
            (&this_00->data,(size_type)(pcVar5 + (0x20 - (long)pcVar6)));
  pcVar7 = (this->reductionValues).data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  *(double *)(pcVar5 + ((long)pcVar7 - (long)pcVar6)) = local_48;
  *(double *)(pcVar5 + (long)(pcVar7 + (8 - (long)pcVar6))) = local_40;
  *(int *)(pcVar5 + (long)(pcVar7 + (0x10 - (long)pcVar6))) = iVar1;
  *(int *)(pcVar5 + (long)(pcVar7 + (0x14 - (long)pcVar6))) = iVar9;
  *(RowType *)(pcVar5 + (long)(pcVar7 + (0x18 - (long)pcVar6))) = local_5c;
  HighsDataStack::push<presolve::HighsPostsolveStack::Nonzero>
            (this_00,(vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
                      *)local_58);
  HighsDataStack::push<presolve::HighsPostsolveStack::Nonzero>(this_00,&this->colValues);
  local_71 = kFreeColSubstitution;
  local_70 = (double)((long)(this->reductionValues).data.
                            super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                     (long)(this->reductionValues).data.
                           super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_start);
  std::
  vector<std::pair<presolve::HighsPostsolveStack::ReductionType,unsigned_long>,std::allocator<std::pair<presolve::HighsPostsolveStack::ReductionType,unsigned_long>>>
  ::emplace_back<presolve::HighsPostsolveStack::ReductionType&,unsigned_long&>
            ((vector<std::pair<presolve::HighsPostsolveStack::ReductionType,unsigned_long>,std::allocator<std::pair<presolve::HighsPostsolveStack::ReductionType,unsigned_long>>>
              *)&this->reductions,&local_71,(unsigned_long *)&local_70);
  return;
}

Assistant:

void freeColSubstitution(HighsInt row, HighsInt col, double rhs,
                           double colCost, RowType rowType,
                           const HighsMatrixSlice<RowStorageFormat>& rowVec,
                           const HighsMatrixSlice<ColStorageFormat>& colVec) {
    rowValues.clear();
    for (const HighsSliceNonzero& rowVal : rowVec)
      rowValues.emplace_back(origColIndex[rowVal.index()], rowVal.value());

    colValues.clear();
    for (const HighsSliceNonzero& colVal : colVec)
      colValues.emplace_back(origRowIndex[colVal.index()], colVal.value());

    reductionValues.push(FreeColSubstitution{rhs, colCost, origRowIndex[row],
                                             origColIndex[col], rowType});
    reductionValues.push(rowValues);
    reductionValues.push(colValues);
    reductionAdded(ReductionType::kFreeColSubstitution);
  }